

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int SDL_InitSubSystem(Uint32 sdl12flags)

{
  uint uVar1;
  int iVar2;
  SDL_bool SVar3;
  SDL_JoystickID SVar4;
  char *pcVar5;
  SDL20_GameControllerNameForIndex_t *pp_Var6;
  char *pcVar7;
  SDL20_GameControllerOpen_t *pp_Var8;
  SDL_GameController *pSVar9;
  SDL12_Joystick *pSVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  uVar1 = ~InitializedSubsystems20 & sdl12flags & 1;
  uVar12 = (InitializedSubsystems20 & 0x10 | uVar1) ^ 0x10;
  if ((sdl12flags & 0x10) == 0) {
    uVar12 = uVar1;
  }
  uVar1 = (InitializedSubsystems20 & 0x20 | uVar12) ^ 0x20;
  if ((sdl12flags & 0x20) == 0) {
    uVar1 = uVar12;
  }
  uVar12 = ~InitializedSubsystems20 & sdl12flags & 0x100200;
  uVar13 = uVar12 | uVar1;
  if (((sdl12flags >> 8 & 1) != 0) && (CDRomInit == '\0')) {
    pcVar5 = (*SDL20_getenv)("SDL12COMPAT_FAKE_CDROM_PATH");
    if (pcVar5 != (char *)0x0) {
      CDRomPath = (*SDL20_strdup)(pcVar5);
    }
    CDRomInit = '\x01';
  }
  iVar2 = (*SDL20_Init)(uVar13);
  if ((iVar2 == 0) && (iVar2 = 0, (uVar1 & 0x20) != 0)) {
    iVar2 = Init12Video();
    EventThreadEnabled = sdl12flags >> 0x18 & SDL_TRUE;
  }
  if ((iVar2 == 0) && ((uVar1 & 0x10) != 0)) {
    WantCompatibilityAudioCVT =
         SDL12Compat_GetHintBoolean("SDL12COMPAT_COMPATIBILITY_AUDIOCVT",SDL_FALSE);
  }
  if ((uVar12 >> 9 & 1) == 0 || iVar2 != 0) goto LAB_001079aa;
  JoysticksAreGameControllers =
       SDL12Compat_GetHintBoolean("SDL12COMPAT_USE_GAME_CONTROLLERS",SDL_FALSE);
  NumJoysticks = 0;
  (*SDL20_LockJoysticks)();
  uVar1 = (*SDL20_NumJoysticks)();
  uVar12 = 0xff;
  if ((int)uVar1 < 0xff) {
    uVar12 = uVar1;
  }
  if ((int)uVar1 < 1) {
    JoystickList = (SDL12_Joystick *)0x0;
  }
  else {
    JoystickList = (SDL12_Joystick *)(*SDL20_calloc)((ulong)uVar12,0x18);
    if (JoystickList != (SDL12_Joystick *)0x0) {
      for (uVar1 = 0; uVar12 != uVar1; uVar1 = uVar1 + 1) {
        if (JoysticksAreGameControllers == SDL_FALSE) {
LAB_00107885:
          pp_Var6 = &SDL20_JoystickNameForIndex;
LAB_0010788c:
          pcVar7 = (**pp_Var6)(uVar1);
          pcVar5 = "Generic SDL2 Game Controller";
          if (JoysticksAreGameControllers == SDL_FALSE) {
            pcVar5 = "Generic SDL2 Joystick";
          }
          if (pcVar7 != (char *)0x0) {
            pcVar5 = pcVar7;
          }
          pcVar5 = (*SDL20_strdup)(pcVar5);
          JoystickList[NumJoysticks].name = pcVar5;
          if (pcVar5 != (char *)0x0) {
            pp_Var8 = &SDL20_GameControllerOpen;
            if (JoysticksAreGameControllers == SDL_FALSE) {
              pp_Var8 = (SDL20_GameControllerOpen_t *)&SDL20_JoystickOpen;
            }
            pSVar9 = (**pp_Var8)(uVar1);
            pSVar10 = JoystickList;
            lVar11 = (long)NumJoysticks;
            JoystickList[lVar11].dev.controller = pSVar9;
            if (pSVar9 == (SDL_GameController *)0x0) {
              (*SDL20_free)(pSVar10[lVar11].name);
              JoystickList[NumJoysticks].name = (char *)0x0;
            }
            SVar4 = (*SDL20_JoystickGetDeviceInstanceID)(uVar1);
            JoystickList[NumJoysticks].instance_id = SVar4;
            NumJoysticks = NumJoysticks + 1;
          }
        }
        else {
          SVar3 = (*SDL20_IsGameController)(uVar1);
          if (SVar3 != SDL_FALSE) {
            pp_Var6 = &SDL20_GameControllerNameForIndex;
            if (JoysticksAreGameControllers == SDL_FALSE) goto LAB_00107885;
            goto LAB_0010788c;
          }
        }
      }
    }
  }
  (*SDL20_UnlockJoysticks)();
  if (JoystickList == (SDL12_Joystick *)0x0 || (long)NumJoysticks != 0) {
    if ((int)uVar12 <= NumJoysticks) goto LAB_001079aa;
    pSVar10 = (SDL12_Joystick *)(*SDL20_realloc)(JoystickList,(long)NumJoysticks * 0x18);
    if (pSVar10 == (SDL12_Joystick *)0x0) goto LAB_001079aa;
  }
  else {
    (*SDL20_free)(JoystickList);
    pSVar10 = (SDL12_Joystick *)0x0;
  }
  JoystickList = pSVar10;
LAB_001079aa:
  InitializedSubsystems20 = InitializedSubsystems20 | uVar13;
  return iVar2;
}

Assistant:

SDLCALL
SDL_InitSubSystem(Uint32 sdl12flags)
{
    Uint32 sdl20flags = 0;
    int rc;

#ifdef __WINDOWS__
    /* DOSBox (and probably other things), try to force the "windib" video
       backend, but it doesn't exist in SDL2. Force to "windows" instead. */
    const char *origvidenv = NULL;
    const char *env = SDL20_getenv("SDL_VIDEODRIVER");
    if (env) {
        if (SDL20_strcmp(env, "windib") == 0) {
            origvidenv = "windib";
            SDL20_setenv("SDL_VIDEODRIVER", "windows", 1);
        } else
        if (SDL20_strcmp(env, "directx") == 0) {
            origvidenv = "directx";
            SDL20_setenv("SDL_VIDEODRIVER", "windows", 1);
        }
    }
#endif

#ifdef __MACOSX__
    extern void sdl12_compat_macos_init(void);
    sdl12_compat_macos_init();
#endif

    /* note that currently we ignore SDL12_INIT_NOPARACHUTE, since
       there _isn't_ a parachute in SDL2, and mostly it was meant to deal
       with X11's XVidMode leaving the display resolution busted if the app
       didn't call SDL_Quit() before leaving...but most sdl12-compat cases
       (except OpenGL rendering without logical scaling) use
       FULLSCREEN_DESKTOP for fullscreen modes, and modern X11 doesn't
       have this problem, so we're ignoring the parachute until a reasonable
       need arises. */

    #define SETFLAG(flag) { \
        const Uint32 f12 = SDL12_INIT_##flag; \
        const Uint32 f20 = SDL_INIT_##flag; \
        if ((sdl12flags & f12) && ((InitializedSubsystems20 & f20) == 0)) { \
            sdl20flags |= f20; \
        } \
    }

    SETFLAG(TIMER);
    SETFLAG(AUDIO);
    SETFLAG(VIDEO);
    SETFLAG(JOYSTICK);
    SETFLAG(NOPARACHUTE);
    #undef SETFLAG

    /* There's no CDROM in 2.0, but we fake it. */
    if (sdl12flags & SDL12_INIT_CDROM) {
        /* this never reports failure, even if there's a legit problem. You just won't see any drives. */
        InitializeCDSubsystem();
    }

    rc = SDL20_Init(sdl20flags);
    if ((rc == 0) && (sdl20flags & SDL_INIT_VIDEO)) {
        if (Init12Video() < 0) {
            rc = -1;
        }

        /* SDL_INIT_EVENTTHREAD takes effect when SDL_INIT_VIDEO is also set */
        EventThreadEnabled = (sdl12flags & SDL12_INIT_EVENTTHREAD) ? SDL_TRUE : SDL_FALSE;
    }

#ifdef __WINDOWS__
    if (origvidenv) {  /* set this back to minimize surprise state changes. */
        SDL20_setenv("SDL_VIDEODRIVER", origvidenv, 1);
    }
#endif

    if ((rc == 0) && (sdl20flags & SDL_INIT_AUDIO)) {
        Init12Audio();
    }

    if ((rc == 0) && (sdl20flags & SDL_INIT_JOYSTICK)) {
        Init12Joystick();  /* if this fails, we just won't report any sticks. */
    }

    InitializedSubsystems20 |= sdl20flags;

    return rc;
}